

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::makeSmallShrS
          (I64ToI32Lowering *this,Index highBits,Index leftLow,Index leftHigh,Index shift,
          Binary *shiftMask,Binary *widthLessShift)

{
  Index IVar1;
  Index index;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  LocalGet *pLVar5;
  Binary *pBVar6;
  LocalGet *pLVar7;
  pointer pBVar8;
  LocalSet *any;
  Block *pBVar9;
  Type local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  Binary *local_40;
  Binary *shiftLow;
  Binary *local_30;
  Binary *shiftedInBits;
  Binary *shiftMask_local;
  Index shift_local;
  Index leftHigh_local;
  Index leftLow_local;
  Index highBits_local;
  I64ToI32Lowering *this_local;
  
  shiftedInBits = shiftMask;
  shiftMask_local._0_4_ = shift;
  shiftMask_local._4_4_ = leftHigh;
  shift_local = leftLow;
  leftHigh_local = highBits;
  _leftLow_local = this;
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar6 = shiftedInBits;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = shiftMask_local._4_4_;
  wasm::Type::Type((Type *)&shiftLow,i32);
  pLVar5 = Builder::makeLocalGet(pBVar4,IVar1,(Type)shiftLow);
  pBVar6 = Builder::makeBinary(pBVar3,AndInt32,(Expression *)pBVar6,(Expression *)pLVar5);
  local_30 = Builder::makeBinary(pBVar2,ShlInt32,(Expression *)pBVar6,(Expression *)widthLessShift);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = shift_local;
  wasm::Type::Type(&local_48,i32);
  pLVar5 = Builder::makeLocalGet(pBVar3,IVar1,local_48);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = (Index)shiftMask_local;
  wasm::Type::Type(&local_50,i32);
  pLVar7 = Builder::makeLocalGet(pBVar3,IVar1,local_50);
  local_40 = Builder::makeBinary(pBVar2,ShrUInt32,(Expression *)pLVar5,(Expression *)pLVar7);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  index = leftHigh_local;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar8 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = shiftMask_local._4_4_;
  wasm::Type::Type(&local_58,i32);
  pLVar5 = Builder::makeLocalGet(pBVar8,IVar1,local_58);
  pBVar8 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = (Index)shiftMask_local;
  wasm::Type::Type(&local_60,i32);
  pLVar7 = Builder::makeLocalGet(pBVar8,IVar1,local_60);
  pBVar6 = Builder::makeBinary(pBVar4,ShrSInt32,(Expression *)pLVar5,(Expression *)pLVar7);
  any = Builder::makeLocalSet(pBVar3,index,(Expression *)pBVar6);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar6 = Builder::makeBinary(pBVar3,OrInt32,(Expression *)local_30,(Expression *)local_40);
  pBVar9 = Builder::blockify(pBVar2,(Expression *)any,(Expression *)pBVar6);
  return pBVar9;
}

Assistant:

Block* makeSmallShrS(Index highBits,
                       Index leftLow,
                       Index leftHigh,
                       Index shift,
                       Binary* shiftMask,
                       Binary* widthLessShift) {
    Binary* shiftedInBits = builder->makeBinary(
      ShlInt32,
      builder->makeBinary(
        AndInt32, shiftMask, builder->makeLocalGet(leftHigh, Type::i32)),
      widthLessShift);
    Binary* shiftLow =
      builder->makeBinary(ShrUInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(shift, Type::i32));
    return builder->blockify(
      builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShrSInt32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeLocalGet(shift, Type::i32))),
      builder->makeBinary(OrInt32, shiftedInBits, shiftLow));
  }